

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::Exception::ExceptionMessageMatcher::ExceptionMessageMatcher
          (ExceptionMessageMatcher *this,string *message)

{
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.m_cachedToString._M_dataplus.
  _M_p = (pointer)&(this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.
                   m_cachedToString.field_2;
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.m_cachedToString.
  _M_string_length = 0;
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase.m_cachedToString.field_2.
  _M_local_buf[0] = '\0';
  (this->super_MatcherBase<std::exception>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__ExceptionMessageMatcher_0017ac70;
  (this->super_MatcherBase<std::exception>).super_MatcherMethod<std::exception>._vptr_MatcherMethod
       = (_func_int **)&DAT_0017aca0;
  std::__cxx11::string::string((string *)&this->m_message,message);
  return;
}

Assistant:

ExceptionMessageMatcher(std::string const& message):
        m_message(message)
    {}